

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

string * __thiscall cli::Parser::usage_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  pointer ppCVar1;
  ostream *poVar2;
  pointer ppCVar3;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"Available parameters:\n\n");
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->_commands).
                 super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar1;
      ppCVar3 = ppCVar3 + 1) {
    poVar2 = std::operator<<(local_1a8,"  ");
    poVar2 = std::operator<<(poVar2,(string *)&(*ppCVar3)->command);
    poVar2 = std::operator<<(poVar2,"\t");
    std::operator<<(poVar2,(string *)&(*ppCVar3)->alternative);
    if ((*ppCVar3)->required == true) {
      std::operator<<(local_1a8,"\t(required)");
    }
    poVar2 = std::operator<<(local_1a8,"\n   ");
    std::operator<<(poVar2,(string *)&(*ppCVar3)->description);
    if ((*ppCVar3)->required == false) {
      poVar2 = std::operator<<(local_1a8,"\n   ");
      (*(*ppCVar3)->_vptr_CmdBase[2])(&local_1f8);
      std::operator+(&local_1d8,"This parameter is optional. The default value is \'",&local_1f8);
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      std::operator<<(poVar2,"\'.");
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    std::operator<<(local_1a8,"\n\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string usage() const {
			std::stringstream ss { };
			ss << "Available parameters:\n\n";

			for (const auto& command : _commands) {
				ss << "  " << command->command << "\t" << command->alternative; 

				if (command->required == true) {
					ss << "\t(required)";
				}

				ss << "\n   " << command->description;

				if (command->required == false) {
					ss << "\n   " << "This parameter is optional. The default value is '" + command->print_value() << "'.";
				}

				ss << "\n\n";
			}

			return ss.str();
		}